

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_db27f7::KeyConverter::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          KeyConverter *this,CPubKey *key)

{
  long lVar1;
  byte bVar2;
  allocator_type *__a;
  uchar *__last;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  allocator_type local_29;
  undefined1 local_28 [40];
  
  local_28._32_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if ((int)this == 0) {
    lVar1 = 0x21;
    if ((key->vch[0] & 0xfe) != 2) {
      bVar2 = key->vch[0] - 4;
      if (bVar2 < 4) {
        lVar1 = *(long *)(&DAT_00e3c9f0 + (ulong)bVar2 * 8);
      }
      else {
        lVar1 = 0;
      }
    }
    __last = key->vch + lVar1;
    __a = (allocator_type *)local_28;
  }
  else {
    if ((int)this != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    local_28._0_8_ = *(undefined8 *)(key->vch + 1);
    local_28._8_8_ = *(undefined8 *)(key->vch + 9);
    local_28._16_8_ = *(undefined8 *)(key->vch + 0x11);
    local_28._24_8_ = *(undefined8 *)(key->vch + 0x19);
    __last = local_28 + 0x20;
    key = (CPubKey *)local_28;
    __a = &local_29;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,key->vch,
             __last,__a);
  if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) ==
      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28._32_8_) {
    return *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(const CPubKey& key) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {key.begin(), key.end()};
        }
        const XOnlyPubKey xonly_pubkey{key};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }